

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

void fmt::v7::detail::fallback_format<double>
               (double d,int num_digits,bool binary32,buffer<char> *buf,int *exp10)

{
  char *pcVar1;
  char cVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  bigint *lhs2;
  uint64_t value;
  ulong uVar6;
  uint uVar7;
  undefined7 in_register_00000031;
  bool bVar8;
  ulong uVar9;
  long lVar10;
  int iVar11;
  float fVar12;
  bigint denominator;
  bigint numerator;
  bigint lower;
  bigint upper_store;
  bigint *local_318;
  bigint local_2f0;
  bigint local_240;
  bigint local_190;
  bigint local_e0;
  
  uVar5 = (ulong)(uint)num_digits;
  local_240.bigits_.super_buffer<unsigned_int>.ptr_ = local_240.bigits_.store_;
  local_240.bigits_.super_buffer<unsigned_int>.size_ = 0;
  local_240.bigits_.super_buffer<unsigned_int>._vptr_buffer = (_func_int **)&PTR_grow_007999a0;
  local_2f0.bigits_.super_buffer<unsigned_int>.size_ = 0;
  local_2f0.bigits_.super_buffer<unsigned_int>._vptr_buffer = (_func_int **)&PTR_grow_007999a0;
  local_190.bigits_.super_buffer<unsigned_int>.size_ = 0;
  local_190.bigits_.super_buffer<unsigned_int>._vptr_buffer = (_func_int **)&PTR_grow_007999a0;
  local_2f0.bigits_.super_buffer<unsigned_int>.ptr_ = local_2f0.bigits_.store_;
  local_240.bigits_.super_buffer<unsigned_int>.capacity_ = 0x20;
  local_240.exp_ = 0;
  local_190.bigits_.super_buffer<unsigned_int>.ptr_ = local_190.bigits_.store_;
  local_2f0.bigits_.super_buffer<unsigned_int>.capacity_ = 0x20;
  local_2f0.exp_ = 0;
  local_318 = &local_e0;
  local_190.bigits_.super_buffer<unsigned_int>.capacity_ = 0x20;
  local_190.exp_ = 0;
  local_e0.bigits_.super_buffer<unsigned_int>.ptr_ = local_e0.bigits_.store_;
  local_e0.bigits_.super_buffer<unsigned_int>.size_ = 0;
  local_e0.bigits_.super_buffer<unsigned_int>._vptr_buffer = (_func_int **)&PTR_grow_007999a0;
  local_e0.bigits_.super_buffer<unsigned_int>.capacity_ = 0x20;
  local_e0.exp_ = 0;
  if ((int)CONCAT71(in_register_00000031,binary32) == 0) {
    uVar9 = (ulong)d & 0xfffffffffffff;
    uVar7 = (uint)((ulong)d >> 0x34) & 0x7ff;
    bVar8 = 1 < uVar7 && uVar9 == 0;
    if (uVar7 == 0) {
      iVar3 = -0x432;
      goto LAB_0012a8e7;
    }
    iVar3 = uVar7 - 0x433;
    uVar9 = uVar9 + 0x10000000000000;
LAB_0012a858:
    iVar11 = bVar8 + 1;
    value = uVar9 << iVar11;
    if (iVar3 < 0) goto LAB_0012a8f3;
    bigint::assign(&local_240,value);
    bigint::operator<<=(&local_240,iVar3);
    bigint::assign(&local_190,1);
    bigint::operator<<=(&local_190,iVar3);
    if (bVar8 == false) {
      local_318 = (bigint *)0x0;
    }
    else {
      local_318 = &local_e0;
      bigint::assign(local_318,1);
      bigint::operator<<=(&local_e0,iVar3 + 1);
    }
    bigint::assign_pow10(&local_2f0,*exp10);
    bigint::operator<<=(&local_2f0,iVar11);
  }
  else {
    fVar12 = (float)d;
    iVar3 = -0x95;
    uVar9 = (ulong)((uint)fVar12 & 0x7fffff);
    bVar8 = 0xffffff < (uint)fVar12 && ((uint)fVar12 & 0x7fffff) == 0;
    if (0x7fffff < (uint)fVar12) {
      uVar9 = uVar9 | 0x800000;
      iVar3 = ((uint)fVar12 >> 0x17) - 0x96;
      goto LAB_0012a858;
    }
LAB_0012a8e7:
    iVar11 = bVar8 + 1;
    value = uVar9 << iVar11;
LAB_0012a8f3:
    if (*exp10 < 0) {
      bigint::assign_pow10(&local_240,-*exp10);
      bigint::assign(&local_190,&local_240);
      if (bVar8 == false) {
        local_318 = (bigint *)0x0;
      }
      else {
        local_318 = &local_e0;
        bigint::assign(local_318,&local_240);
        bigint::operator<<=(&local_e0,1);
      }
      bigint::operator*=(&local_240,value);
      bigint::assign(&local_2f0,1);
      bigint::operator<<=(&local_2f0,iVar11 - iVar3);
    }
    else {
      bigint::assign(&local_240,value);
      bigint::assign_pow10(&local_2f0,*exp10);
      bigint::operator<<=(&local_2f0,iVar11 - iVar3);
      bigint::assign(&local_190,1);
      if (bVar8 == false) {
        local_318 = (bigint *)0x0;
      }
      else {
        bigint::assign(&local_e0,2);
      }
    }
  }
  if (-1 < num_digits) {
    *exp10 = *exp10 - (num_digits + -1);
    uVar7 = num_digits - 1;
    if (num_digits == 0) {
      uVar5 = 1;
      if (buf->capacity_ == 0) {
        (**buf->_vptr_buffer)(buf,1);
        uVar5 = (ulong)(buf->capacity_ != 0);
      }
      buf->size_ = uVar5;
      bigint::multiply(&local_2f0,10);
      iVar3 = add_compare(&local_240,&local_240,&local_2f0);
      *buf->ptr_ = 0 < iVar3 | 0x30;
    }
    else {
      uVar6 = (ulong)(uint)num_digits;
      uVar9 = buf->capacity_;
      if (uVar9 < uVar6) {
        (**buf->_vptr_buffer)(buf,uVar6);
        uVar9 = buf->capacity_;
      }
      if (uVar9 < uVar6) {
        uVar6 = uVar9;
      }
      buf->size_ = uVar6;
      if (num_digits != 1) {
        uVar9 = 0;
        do {
          iVar3 = bigint::divmod_assign(&local_240,&local_2f0);
          buf->ptr_[uVar9] = (char)iVar3 + '0';
          bigint::multiply(&local_240,10);
          uVar9 = uVar9 + 1;
        } while (uVar7 != uVar9);
      }
      uVar4 = bigint::divmod_assign(&local_240,&local_2f0);
      iVar3 = add_compare(&local_240,&local_240,&local_2f0);
      if ((0 < iVar3) || ((uVar4 & 1) != 0 && iVar3 == 0)) {
        if (uVar4 == 9) {
          buf->ptr_[(int)uVar7] = ':';
          if (num_digits != 1) {
            uVar9 = (ulong)(num_digits - 2);
            do {
              uVar7 = (int)uVar5 - 1;
              uVar5 = (ulong)uVar7;
              if (buf->ptr_[uVar5] != ':') break;
              buf->ptr_[uVar5] = '0';
              buf->ptr_[uVar9] = buf->ptr_[uVar9] + '\x01';
              uVar9 = uVar9 - 1;
            } while (1 < (int)uVar7);
          }
          if (*buf->ptr_ == ':') {
            *buf->ptr_ = '1';
            *exp10 = *exp10 + 1;
          }
          goto LAB_0012ad2f;
        }
        uVar4 = uVar4 + 1;
      }
      buf->ptr_[(int)uVar7] = (char)uVar4 + '0';
    }
    goto LAB_0012ad2f;
  }
  pcVar1 = buf->ptr_;
  lhs2 = local_318;
  if (local_318 == (bigint *)0x0) {
    lhs2 = &local_190;
  }
  uVar7 = ~(uint)uVar9 & 1;
  lVar10 = 0;
  while( true ) {
    uVar4 = bigint::divmod_assign(&local_240,&local_2f0);
    iVar3 = compare(&local_240,&local_190);
    iVar11 = add_compare(&local_240,lhs2,&local_2f0);
    pcVar1[lVar10] = (char)uVar4 + '0';
    if ((iVar3 < (int)uVar7) || ((int)-uVar7 < iVar11)) break;
    bigint::multiply(&local_240,10);
    bigint::multiply(&local_190,10);
    if (local_318 != (bigint *)0x0) {
      bigint::multiply(local_318,10);
    }
    lVar10 = lVar10 + 1;
  }
  if (iVar3 < (int)uVar7) {
    if ((int)-uVar7 < iVar11) {
      iVar3 = add_compare(&local_240,&local_240,&local_2f0);
      if ((0 < iVar3) || ((uVar4 & 1) != 0 && iVar3 == 0)) {
        cVar2 = pcVar1[lVar10] + '\x01';
        goto LAB_0012acda;
      }
    }
  }
  else {
    cVar2 = (char)uVar4 + '1';
LAB_0012acda:
    pcVar1[lVar10] = cVar2;
  }
  uVar9 = lVar10 + 1U & 0xffffffff;
  uVar5 = buf->capacity_;
  if (uVar5 < uVar9) {
    (**buf->_vptr_buffer)(buf,uVar9);
    uVar5 = buf->capacity_;
  }
  if (uVar5 < uVar9) {
    uVar9 = uVar5;
  }
  buf->size_ = uVar9;
  *exp10 = *exp10 - (int)lVar10;
LAB_0012ad2f:
  bigint::~bigint(&local_e0);
  bigint::~bigint(&local_190);
  bigint::~bigint(&local_2f0);
  bigint::~bigint(&local_240);
  return;
}

Assistant:

void fallback_format(Double d, int num_digits, bool binary32, buffer<char>& buf,
                     int& exp10) {
  bigint numerator;    // 2 * R in (FPP)^2.
  bigint denominator;  // 2 * S in (FPP)^2.
  // lower and upper are differences between value and corresponding boundaries.
  bigint lower;             // (M^- in (FPP)^2).
  bigint upper_store;       // upper's value if different from lower.
  bigint* upper = nullptr;  // (M^+ in (FPP)^2).
  fp value;
  // Shift numerator and denominator by an extra bit or two (if lower boundary
  // is closer) to make lower and upper integers. This eliminates multiplication
  // by 2 during later computations.
  const bool is_predecessor_closer =
      binary32 ? value.assign(static_cast<float>(d)) : value.assign(d);
  int shift = is_predecessor_closer ? 2 : 1;
  uint64_t significand = value.f << shift;
  if (value.e >= 0) {
    numerator.assign(significand);
    numerator <<= value.e;
    lower.assign(1);
    lower <<= value.e;
    if (shift != 1) {
      upper_store.assign(1);
      upper_store <<= value.e + 1;
      upper = &upper_store;
    }
    denominator.assign_pow10(exp10);
    denominator <<= shift;
  } else if (exp10 < 0) {
    numerator.assign_pow10(-exp10);
    lower.assign(numerator);
    if (shift != 1) {
      upper_store.assign(numerator);
      upper_store <<= 1;
      upper = &upper_store;
    }
    numerator *= significand;
    denominator.assign(1);
    denominator <<= shift - value.e;
  } else {
    numerator.assign(significand);
    denominator.assign_pow10(exp10);
    denominator <<= shift - value.e;
    lower.assign(1);
    if (shift != 1) {
      upper_store.assign(1ULL << 1);
      upper = &upper_store;
    }
  }
  // Invariant: value == (numerator / denominator) * pow(10, exp10).
  if (num_digits < 0) {
    // Generate the shortest representation.
    if (!upper) upper = &lower;
    bool even = (value.f & 1) == 0;
    num_digits = 0;
    char* data = buf.data();
    for (;;) {
      int digit = numerator.divmod_assign(denominator);
      bool low = compare(numerator, lower) - even < 0;  // numerator <[=] lower.
      // numerator + upper >[=] pow10:
      bool high = add_compare(numerator, *upper, denominator) + even > 0;
      data[num_digits++] = static_cast<char>('0' + digit);
      if (low || high) {
        if (!low) {
          ++data[num_digits - 1];
        } else if (high) {
          int result = add_compare(numerator, numerator, denominator);
          // Round half to even.
          if (result > 0 || (result == 0 && (digit % 2) != 0))
            ++data[num_digits - 1];
        }
        buf.try_resize(to_unsigned(num_digits));
        exp10 -= num_digits - 1;
        return;
      }
      numerator *= 10;
      lower *= 10;
      if (upper != &lower) *upper *= 10;
    }
  }
  // Generate the given number of digits.
  exp10 -= num_digits - 1;
  if (num_digits == 0) {
    buf.try_resize(1);
    denominator *= 10;
    buf[0] = add_compare(numerator, numerator, denominator) > 0 ? '1' : '0';
    return;
  }
  buf.try_resize(to_unsigned(num_digits));
  for (int i = 0; i < num_digits - 1; ++i) {
    int digit = numerator.divmod_assign(denominator);
    buf[i] = static_cast<char>('0' + digit);
    numerator *= 10;
  }
  int digit = numerator.divmod_assign(denominator);
  auto result = add_compare(numerator, numerator, denominator);
  if (result > 0 || (result == 0 && (digit % 2) != 0)) {
    if (digit == 9) {
      const auto overflow = '0' + 10;
      buf[num_digits - 1] = overflow;
      // Propagate the carry.
      for (int i = num_digits - 1; i > 0 && buf[i] == overflow; --i) {
        buf[i] = '0';
        ++buf[i - 1];
      }
      if (buf[0] == overflow) {
        buf[0] = '1';
        ++exp10;
      }
      return;
    }
    ++digit;
  }
  buf[num_digits - 1] = static_cast<char>('0' + digit);
}